

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<int> __thiscall
node::anon_unknown_2::ChainImpl::findLocatorFork(ChainImpl *this,CBlockLocator *locator)

{
  ChainstateManager *this_00;
  Chainstate *this_01;
  CBlockIndex *pCVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x23a,false);
  this_00 = chainman(this);
  this_01 = ChainstateManager::ActiveChainstate(this_00);
  pCVar1 = Chainstate::FindForkInGlobalIndex(this_01,locator);
  if (pCVar1 == (CBlockIndex *)0x0) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)(uint)pCVar1->nHeight;
    uVar3 = 0x100000000;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar2 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int> findLocatorFork(const CBlockLocator& locator) override
    {
        LOCK(::cs_main);
        if (const CBlockIndex* fork = chainman().ActiveChainstate().FindForkInGlobalIndex(locator)) {
            return fork->nHeight;
        }
        return std::nullopt;
    }